

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring64map.hh
# Opt level: O2

Roaring64Map * __thiscall roaring::Roaring64Map::operator&=(Roaring64Map *this,Roaring64Map *other)

{
  bool bVar1;
  _Rb_tree_iterator<std::pair<const_unsigned_int,_roaring::Roaring>_> _Var2;
  const_iterator cVar3;
  _Rb_tree_iterator<std::pair<const_unsigned_int,_roaring::Roaring>_> __x;
  uint self_key;
  
  if (this != other) {
    _Var2._M_node = (this->roarings)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
LAB_0010fca4:
    __x._M_node = _Var2._M_node;
    if ((_Rb_tree_header *)__x._M_node != &(this->roarings)._M_t._M_impl.super__Rb_tree_header) {
      _Var2 = std::next<std::_Rb_tree_iterator<std::pair<unsigned_int_const,roaring::Roaring>>>
                        (__x,1);
      self_key = __x._M_node[1]._M_color;
      cVar3 = std::
              _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_roaring::Roaring>,_std::_Select1st<std::pair<const_unsigned_int,_roaring::Roaring>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_roaring::Roaring>_>_>
              ::find((_Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_roaring::Roaring>,_std::_Select1st<std::pair<const_unsigned_int,_roaring::Roaring>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_roaring::Roaring>_>_>
                      *)other,&self_key);
      if ((_Rb_tree_header *)cVar3._M_node != &(other->roarings)._M_t._M_impl.super__Rb_tree_header)
      goto code_r0x0010fcd1;
      goto LAB_0010fcf0;
    }
  }
  return this;
code_r0x0010fcd1:
  Roaring::operator&=((Roaring *)&__x._M_node[1]._M_parent,(Roaring *)&cVar3._M_node[1]._M_parent);
  bVar1 = Roaring::isEmpty((Roaring *)&__x._M_node[1]._M_parent);
  if (bVar1) {
LAB_0010fcf0:
    std::
    _Rb_tree<unsigned_int,std::pair<unsigned_int_const,roaring::Roaring>,std::_Select1st<std::pair<unsigned_int_const,roaring::Roaring>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,roaring::Roaring>>>
    ::erase_abi_cxx11_((_Rb_tree<unsigned_int,std::pair<unsigned_int_const,roaring::Roaring>,std::_Select1st<std::pair<unsigned_int_const,roaring::Roaring>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,roaring::Roaring>>>
                        *)this,(iterator)__x._M_node);
  }
  goto LAB_0010fca4;
}

Assistant:

Roaring64Map &operator&=(const Roaring64Map &other) {
        if (this == &other) {
            // ANDing *this with itself is a no-op.
            return *this;
        }

        // Logic table summarizing what to do when a given outer key is
        // present vs. absent from self and other.
        //
        // self     other    (self & other)  work to do
        // --------------------------------------------
        // absent   absent   empty           None
        // absent   present  empty           None
        // present  absent   empty           Erase self
        // present  present  empty or not    Intersect self with other, but
        //                                   erase self if result is empty.
        //
        // Because there is only work to do when a key is present in 'self', the
        // main for loop iterates over entries in 'self'.

        decltype(roarings.begin()) self_next;
        for (auto self_iter = roarings.begin(); self_iter != roarings.end();
             self_iter = self_next) {
            // Do the 'next' operation now, so we don't have to worry about
            // invalidation of self_iter down below with the 'erase' operation.
            self_next = std::next(self_iter);

            auto self_key = self_iter->first;
            auto &self_bitmap = self_iter->second;

            auto other_iter = other.roarings.find(self_key);
            if (other_iter == other.roarings.end()) {
                // 'other' doesn't have self_key. In the logic table above,
                // this reflects the case (self.present & other.absent).
                // So, erase self.
                roarings.erase(self_iter);
                continue;
            }

            // Both sides have self_key. In the logic table above, this reflects
            // the case (self.present & other.present). So, intersect self with
            // other.
            const auto &other_bitmap = other_iter->second;
            self_bitmap &= other_bitmap;
            if (self_bitmap.isEmpty()) {
                // ...but if intersection is empty, remove it altogether.
                roarings.erase(self_iter);
            }
        }
        return *this;
    }